

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_upvaluejoin(lua_State *L)

{
  uint uVar1;
  int iVar2;
  int32_t iVar3;
  GCfunc *pGVar4;
  long lVar5;
  GCRef *p [2];
  GCfunc *fn [2];
  uint *local_38 [2];
  GCobj *local_28 [2];
  
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 4) {
      uVar1 = *local_38[1];
      *local_38[0] = uVar1;
      if ((((((GCobj *)(ulong)uVar1)->gch).marked & 3) != 0) &&
         (((local_28[0]->gch).marked & 4) != 0)) {
        lj_gc_barrierf((global_State *)(ulong)(L->glref).ptr32,local_28[0],(GCobj *)(ulong)uVar1);
      }
      return 0;
    }
    iVar2 = (int)lVar5;
    pGVar4 = lj_lib_checkfunc(L,iVar2 + 1);
    *(GCfunc **)((long)local_28 + lVar5 * 4) = pGVar4;
    if ((pGVar4->c).ffid != '\0') break;
    iVar3 = lj_lib_checkint(L,iVar2 + 2);
    if ((uint)(pGVar4->c).nupvalues <= iVar3 - 1U) {
      lj_err_arg(L,iVar2 + 2,LJ_ERR_IDXRNG);
    }
    *(ulong *)((long)local_38 + lVar5 * 4) = (long)pGVar4 + (ulong)(iVar3 - 1U) * 4 + 0x14;
    lVar5 = lVar5 + 2;
  }
  lj_err_arg(L,iVar2 + 1,LJ_ERR_NOLFUNC);
}

Assistant:

LJLIB_CF(debug_upvaluejoin)
{
  GCfunc *fn[2];
  GCRef *p[2];
  int i;
  for (i = 0; i < 2; i++) {
    int32_t n;
    fn[i] = lj_lib_checkfunc(L, 2*i+1);
    if (!isluafunc(fn[i]))
      lj_err_arg(L, 2*i+1, LJ_ERR_NOLFUNC);
    n = lj_lib_checkint(L, 2*i+2) - 1;
    if ((uint32_t)n >= fn[i]->l.nupvalues)
      lj_err_arg(L, 2*i+2, LJ_ERR_IDXRNG);
    p[i] = &fn[i]->l.uvptr[n];
  }
  setgcrefr(*p[0], *p[1]);
  lj_gc_objbarrier(L, fn[0], gcref(*p[1]));
  return 0;
}